

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner_tests.cpp
# Opt level: O1

BlockAssembler * __thiscall
miner_tests::MinerTestingSetup::AssemblerForTest
          (BlockAssembler *__return_storage_ptr__,MinerTestingSetup *this,CTxMemPool *tx_mempool)

{
  Chainstate *chainstate;
  long in_FS_OFFSET;
  Options options;
  Options local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.super_BlockCreateOptions.use_mempool = true;
  local_50.super_BlockCreateOptions.coinbase_max_additional_weight = 4000;
  local_50.super_BlockCreateOptions.coinbase_output_max_additional_sigops = 400;
  local_50.test_block_validity = true;
  local_50.print_modified_fee = false;
  local_50.nBlockMaxWeight = 4000000;
  local_50.blockMinFeeRate.nSatoshisPerK = blockMinFeeRate;
  chainstate = ChainstateManager::ActiveChainstate
                         ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup
                          .m_node.chainman._M_t.
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ::node::BlockAssembler::BlockAssembler(__return_storage_ptr__,chainstate,tx_mempool,&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

BlockAssembler MinerTestingSetup::AssemblerForTest(CTxMemPool& tx_mempool)
{
    BlockAssembler::Options options;

    options.nBlockMaxWeight = MAX_BLOCK_WEIGHT;
    options.blockMinFeeRate = blockMinFeeRate;
    return BlockAssembler{m_node.chainman->ActiveChainstate(), &tx_mempool, options};
}